

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_sign.c
# Opt level: O2

int crypto_sign_open(uchar *m,unsigned_long_long *mlen,uchar *sm,unsigned_long_long smlen,uchar *pk)

{
  int iVar1;
  size_t __n;
  ulong uVar2;
  picnic_publickey_t ppk;
  
  if (*pk == '\b') {
    iVar1 = -2;
    if (3 < smlen) {
      uVar2 = (ulong)*(uint *)sm;
      if (uVar2 + 4 <= smlen) {
        iVar1 = picnic_read_public_key(&ppk,pk,0x31);
        if (-1 < iVar1) {
          __n = (smlen - uVar2) - 4;
          iVar1 = picnic_verify(&ppk,sm + 4,__n,sm + (smlen - uVar2),uVar2);
          if (iVar1 == 0) {
            memmove(m,sm + 4,__n);
            iVar1 = 0;
            *mlen = __n;
          }
        }
      }
    }
    return iVar1;
  }
  return -3;
}

Assistant:

int crypto_sign_open(unsigned char* m, unsigned long long* mlen, const unsigned char* sm,
                     unsigned long long smlen, const unsigned char* pk) {
  if (pk[0] != Picnic3_L3) {
    return -3;
  }

  uint32_t signature_len = 0;
  // The signature is too short to hold the signature length.
  if (smlen < sizeof(signature_len)) {
    return -2;
  }

  memcpy(&signature_len, sm, sizeof(signature_len));
  signature_len = le32toh(signature_len);
  // The signature is too short to hold the signature
  if (signature_len + sizeof(signature_len) > smlen) {
    return -2;
  }

  picnic_publickey_t ppk;
  int ret = picnic_read_public_key(&ppk, pk, PICNIC_PUBLIC_KEY_SIZE(Picnic3_L3));
  if (ret < 0) {
    return ret;
  }

  const size_t message_len = smlen - signature_len - sizeof(signature_len);
  const uint8_t* message   = sm + sizeof(signature_len);
  const uint8_t* sig       = sm + sizeof(signature_len) + message_len;

  ret = picnic_verify(&ppk, message, message_len, sig, signature_len);
  if (ret) {
    return ret;
  }

  // The signature is valid, so copy the message to its destination.
  memmove(m, message, message_len);
  *mlen = message_len;

  return 0;
}